

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall hypermind::Lexer::ParseNumber(Lexer *this)

{
  char *__nptr;
  char cVar1;
  HMChar *pHVar2;
  int iVar3;
  uint uVar4;
  HMUINT32 HVar5;
  
  (this->mCurrentToken).type = Number;
  pHVar2 = this->mSource;
  uVar4 = this->mPosition;
  __nptr = pHVar2 + uVar4;
  (this->mCurrentToken).start = __nptr;
  (this->mCurrentToken).length = 0;
  (this->mCurrentToken).line = this->mLine;
  (this->mCurrentToken).value.type = Undefined;
  (this->mCurrentToken).value.field_1.intval = 0;
  HVar5 = 0;
  do {
    uVar4 = uVar4 + 1;
    this->mPosition = uVar4;
    cVar1 = pHVar2[uVar4];
    HVar5 = HVar5 + 1;
  } while (cVar1 == '.' || (byte)(cVar1 - 0x30U) < 10);
  (this->mCurrentToken).length = HVar5;
  (this->mCurrentToken).value.type = Integer;
  iVar3 = atoi(__nptr);
  (this->mCurrentToken).value.field_1.intval = iVar3;
  return;
}

Assistant:

void Lexer::ParseNumber() {
        // TODO 浮点数的支持
        TOKEN(TokenType::Number, 0);
        do {
            NEXT();
        } while (IsNumber(CURRENT_CHAR) || CURRENT_CHAR == _HM_C('.'));
        TOKEN_LENGTH((HMUINT32)(CURRENT_POS - TOKEN_START));
        mCurrentToken.value.type = ValueType::Integer;
        mCurrentToken.value.intval = (int) hm_strtoi(mCurrentToken.start);
    }